

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extfilt.h
# Opt level: O0

clock_t __thiscall ExternalFilter::clock(ExternalFilter *this)

{
  int iVar1;
  int in_ESI;
  sound_sample dVhp;
  sound_sample dVlp;
  sound_sample Vi_local;
  ExternalFilter *this_local;
  
  if ((this->enabled & 1U) == 0) {
    this->Vhp = 0;
    this->Vlp = 0;
    this->Vo = in_ESI - this->mixer_DC;
  }
  else {
    iVar1 = this->Vlp;
    this->Vo = this->Vlp - this->Vhp;
    this->Vlp = ((this->w0lp >> 8) * (in_ESI - this->Vlp) >> 0xc) + this->Vlp;
    this->Vhp = (this->w0hp * (iVar1 - this->Vhp) >> 0x14) + this->Vhp;
  }
  return (clock_t)this;
}

Assistant:

RESID_INLINE
void ExternalFilter::clock(sound_sample Vi)
{
  // This is handy for testing.
  if (!enabled) {
    // Remove maximum DC level since there is no filter to do it.
    Vlp = Vhp = 0;
    Vo = Vi - mixer_DC;
    return;
  }

  // delta_t is converted to seconds given a 1MHz clock by dividing
  // with 1 000 000.

  // Calculate filter outputs.
  // Vo  = Vlp - Vhp;
  // Vlp = Vlp + w0lp*(Vi - Vlp)*delta_t;
  // Vhp = Vhp + w0hp*(Vlp - Vhp)*delta_t;

  sound_sample dVlp = (w0lp >> 8)*(Vi - Vlp) >> 12;
  sound_sample dVhp = w0hp*(Vlp - Vhp) >> 20;
  Vo = Vlp - Vhp;
  Vlp += dVlp;
  Vhp += dVhp;
}